

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector3 cutting_plane_normal_00;
  vector3 cutting_plane_normal_01;
  string in_file_name_00;
  string in_file_name_01;
  vector3 look_at_00;
  vector3 cutting_plane_normal_02;
  vector3 massive_center;
  vector3 massive_center_00;
  CuttingPlane cutting_plane;
  undefined1 auVar2 [24];
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ostream *poVar12;
  undefined7 uVar14;
  ulong uVar13;
  uint uVar15;
  string *psVar16;
  CuttingPlane *in_R8;
  undefined1 uVar17;
  undefined8 in_R9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  undefined1 uVar18;
  undefined7 uVar19;
  undefined8 in_stack_fffffffffffff728;
  int in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  undefined4 uStack_8c8;
  int layer_count;
  byte bVar20;
  int in_stack_fffffffffffff748;
  undefined4 uStack_8b4;
  int in_stack_fffffffffffff750;
  undefined4 uStack_8ac;
  byte local_8a8;
  undefined7 uStack_8a7;
  undefined1 local_8a0;
  undefined7 uStack_89f;
  undefined1 local_898;
  undefined7 uStack_897;
  byte layer_only_specified;
  undefined8 uVar21;
  vector3 *massive_center_01;
  double dVar22;
  int *layer_count_00;
  ulong uVar23;
  double local_870;
  double local_868;
  string in_file_name;
  double layer_before_and;
  double layer_only;
  double transparency;
  double nozzle_width;
  double camera_angle;
  vector3 local_818;
  long *local_7f8;
  long local_7f0;
  long local_7e8 [2];
  undefined8 local_7d8;
  double local_7d0;
  double local_7c8;
  double local_7c0;
  double local_7b8;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  double local_798;
  double local_790;
  double local_788;
  double local_780;
  double local_778;
  double local_770;
  double local_768;
  double cutting_plane_distance;
  vector3 filament_color;
  vector3 look_at;
  vector3 camera_position_vector;
  double local_710;
  double local_708;
  vector3 cutting_plane_normal;
  istringstream ss;
  int local_6e0;
  long local_6d8 [13];
  ios_base local_670 [8];
  ios_base local_668 [264];
  long *local_560 [2];
  long local_550 [2];
  double local_540;
  long *local_538 [2];
  long local_528 [2];
  long *local_518 [2];
  long local_508 [2];
  vector3 local_4f8;
  vector3 local_4e0;
  vector3 local_4c8;
  double local_4b0;
  double local_4a8;
  undefined8 local_4a0;
  vector3 local_498;
  vector3 local_480;
  vector3 local_468;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  double local_438;
  double local_430;
  double local_428;
  double local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  string temp_string;
  ios_base local_360 [264];
  double local_258;
  double local_250;
  double dStack_248;
  fstream configure_file;
  byte abStack_220 [496];
  string *in_file_name_02;
  
  camera_position_vector.x = -100.0;
  camera_position_vector.y = -250.0;
  camera_position_vector.z = 220.0;
  look_at.x = -100.0;
  look_at.y = 100.0;
  look_at.z = 30.0;
  camera_angle = 60.0;
  nozzle_width = 0.4;
  filament_color.x = 0.177;
  filament_color.y = 0.472;
  filament_color.z = 0.59;
  cutting_plane_normal.x = 0.177;
  cutting_plane_normal.y = 0.472;
  cutting_plane_normal.z = 0.59;
  cutting_plane_distance = 0.0;
  transparency = 0.0;
  layer_only = -1.0;
  layer_before_and = -1.0;
  in_file_name._M_dataplus._M_p = (pointer)&in_file_name.field_2;
  in_file_name._M_string_length = 0;
  in_file_name.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading configurations file...\n",0x1f);
  std::fstream::fstream(&configure_file);
  std::fstream::open((char *)&configure_file,0x109720);
  if ((abStack_220[*(long *)(_configure_file + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Configurations file not found.\n",0x1f);
    std::operator<<((ostream *)&std::cout,"Exit.\n");
    exit(0);
  }
  temp_string._M_dataplus._M_p = (pointer)&temp_string.field_2;
  temp_string._M_string_length = 0;
  temp_string.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Parameters derived:\n",0x14);
  layer_count_00 = (int *)0x0;
  uVar21 = 0;
  local_898 = 0;
  uStack_897 = 0;
  local_8a0 = 0;
  uStack_89f = 0;
  local_8a8 = 0;
  uStack_8a7 = 0;
  local_7d8 = 0;
  massive_center_01 = (vector3 *)0x0;
  bVar20 = 0;
  uVar14 = 0;
  while( true ) {
    layer_only_specified = (byte)uVar21;
    uVar17 = (undefined1)in_R9;
    if ((abStack_220[*(long *)(_configure_file + -0x18)] & 2) != 0) break;
    cVar3 = std::ios::widen((char)&stack0xfffffffffffff728 +
                            (char)*(long *)(_configure_file + -0x18) + -0x68);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&configure_file,(string *)&temp_string,cVar3);
    if ((*temp_string._M_dataplus._M_p != '#') || (temp_string._M_dataplus._M_p[1] != '#')) {
      iVar4 = std::__cxx11::string::find((char *)&temp_string,0x10976f,0);
      iVar5 = std::__cxx11::string::find((char *)&temp_string,0x109782,0);
      iVar6 = std::__cxx11::string::find((char *)&temp_string,0x109793,0);
      iVar7 = std::__cxx11::string::find((char *)&temp_string,0x1097a7,0);
      uVar10 = std::__cxx11::string::find((char *)&temp_string,0x1097b3,0);
      in_stack_fffffffffffff730 = (int)uVar10;
      in_stack_fffffffffffff734 = (undefined4)((ulong)uVar10 >> 0x20);
      iVar8 = std::__cxx11::string::find((char *)&temp_string,0x1097bb,0);
      uVar10 = std::__cxx11::string::find((char *)&temp_string,0x1097c1,0);
      in_stack_fffffffffffff750 = (int)uVar10;
      uStack_8ac = (undefined4)((ulong)uVar10 >> 0x20);
      local_868 = (double)std::__cxx11::string::find((char *)&temp_string,0x1097cf,0);
      local_870 = (double)std::__cxx11::string::find((char *)&temp_string,0x1097db,0);
      iVar9 = std::__cxx11::string::find((char *)&temp_string,0x1097ed,0);
      uVar10 = std::__cxx11::string::find((char *)&temp_string,0x109803,0);
      in_stack_fffffffffffff748 = (int)uVar10;
      uStack_8b4 = (undefined4)((ulong)uVar10 >> 0x20);
      uVar10 = 0;
      uVar11 = std::__cxx11::string::find((char *)&temp_string,0x10981b,0);
      if (-1 < (int)uVar11) {
        layer_count_00 = (int *)CONCAT71((int7)((ulong)uVar11 >> 8),1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"make_layer_video=yes\n",0x15);
      }
      if (-1 < iVar4) {
        _ss = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"camera_location=v(","");
        VectorArgumentExtracterStream(&temp_string,iVar4 + local_6e0,&camera_position_vector);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"camera_location=",0x10);
        poVar12 = operator<<((ostream *)&std::cout,&camera_position_vector);
        uStack_89f = (undefined7)((ulong)poVar12 >> 8);
        local_8a0 = 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      if (-1 < iVar5) {
        _ss = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"camera_lookat=v(","");
        VectorArgumentExtracterStream(&temp_string,iVar5 + local_6e0,&look_at);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"camera_lookat=",0xe);
        poVar12 = operator<<((ostream *)&std::cout,&look_at);
        local_7d8 = CONCAT71((int7)((ulong)poVar12 >> 8),1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      if (-1 < iVar6) {
        _ss = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"filament_color=rgb(","");
        VectorArgumentExtracterStream(&temp_string,iVar6 + local_6e0,&filament_color);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"filament_color=",0xf);
        operator<<((ostream *)&std::cout,&filament_color);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      if (-1 < iVar9) {
        _ss = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"cutting_plane_normal=v(","");
        VectorArgumentExtracterStream(&temp_string,iVar9 + local_6e0,&cutting_plane_normal);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"cutting_plane_normal=",0x15);
        poVar12 = operator<<((ostream *)&std::cout,&cutting_plane_normal);
        uVar14 = (undefined7)((ulong)poVar12 >> 8);
        bVar20 = 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      if (-1 < iVar7) {
        _ss = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"view_angle=","");
        ValueArgumentExtracterStream(&temp_string,iVar7 + local_6e0,&camera_angle);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"view_angle=",0xb);
        poVar12 = std::ostream::_M_insert<double>(camera_angle);
        uStack_8a7 = (undefined7)((ulong)uVar10 >> 8);
        uVar10 = CONCAT71(uStack_8a7,1);
        local_8a8 = 1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      }
      if (-1 < in_stack_fffffffffffff730) {
        _ss = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"nozzle_diameter=","");
        ValueArgumentExtracterStream
                  (&temp_string,in_stack_fffffffffffff730 + local_6e0,&nozzle_width);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"nozzle_diameter=",0x10);
        poVar12 = std::ostream::_M_insert<double>(nozzle_width);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      }
      if (-1 < in_stack_fffffffffffff750) {
        _ss = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"transparency=","");
        ValueArgumentExtracterStream
                  (&temp_string,in_stack_fffffffffffff750 + local_6e0,&transparency);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"transparency=",0xd);
        poVar12 = std::ostream::_M_insert<double>(transparency);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      }
      if (-1 < SUB84(local_868,0)) {
        _ss = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"layer_only=","");
        ValueArgumentExtracterStream(&temp_string,SUB84(local_868,0) + local_6e0,&layer_only);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        in_stack_fffffffffffff730 = SUB84(layer_only,0);
        in_stack_fffffffffffff734 = (undefined4)((ulong)layer_only >> 0x20);
        if (0.0 <= layer_only) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"layer_only=",0xb);
          poVar12 = std::ostream::_M_insert<double>
                              ((double)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730)
                              );
          uStack_897 = (undefined7)((ulong)uVar10 >> 8);
          local_898 = 1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        }
      }
      if (-1 < SUB84(local_870,0)) {
        _ss = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"layer_before_and=","");
        ValueArgumentExtracterStream(&temp_string,SUB84(local_870,0) + local_6e0,&layer_before_and);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        in_stack_fffffffffffff730 = SUB84(layer_before_and,0);
        in_stack_fffffffffffff734 = (undefined4)((ulong)layer_before_and >> 0x20);
        if (0.0 <= layer_before_and) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"layer_before_and=",0x11);
          poVar12 = std::ostream::_M_insert<double>
                              ((double)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730)
                              );
          uVar21 = 1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        }
      }
      if (-1 < in_stack_fffffffffffff748) {
        _ss = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"cutting_plane_distance=","");
        ValueArgumentExtracterStream
                  (&temp_string,in_stack_fffffffffffff748 + local_6e0,&cutting_plane_distance);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"cutting_plane_distance=",0x17);
        poVar12 = std::ostream::_M_insert<double>(cutting_plane_distance);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      }
      if (-1 < iVar8) {
        local_7f8 = local_7e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"file=","");
        local_818.x = (double)&local_818.z;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"file=","");
        std::__cxx11::string::substr((ulong)&ss,(ulong)&temp_string);
        std::__cxx11::string::operator=((string *)&in_file_name,(string *)&ss);
        if (_ss != local_6d8) {
          operator_delete(_ss,local_6d8[0] + 1);
        }
        if ((double *)local_818.x != &local_818.z) {
          operator_delete((void *)local_818.x,(long)local_818.z + 1);
        }
        if (local_7f8 != local_7e8) {
          operator_delete(local_7f8,local_7e8[0] + 1);
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&ss,(string *)&in_file_name,_S_in);
        std::operator>>((istream *)&ss,(string *)&in_file_name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"file=",5);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,in_file_name._M_dataplus._M_p,
                             in_file_name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
        uVar10 = std::ios_base::~ios_base(local_670);
        massive_center_01 = (vector3 *)CONCAT71((int7)((ulong)uVar10 >> 8),1);
      }
    }
  }
  paVar1 = &temp_string.field_2;
  if ((bVar20 & 1) != 0) {
    local_868 = cutting_plane_distance;
    in_stack_fffffffffffff750 = SUB84(cutting_plane_normal.y,0);
    uStack_8ac = (undefined4)((ulong)cutting_plane_normal.y >> 0x20);
    in_stack_fffffffffffff730 = SUB84(cutting_plane_normal.x,0);
    in_stack_fffffffffffff734 = (undefined4)((ulong)cutting_plane_normal.x >> 0x20);
    in_stack_fffffffffffff748 = SUB84(cutting_plane_normal.z,0);
    uStack_8b4 = (undefined4)((ulong)cutting_plane_normal.z >> 0x20);
    in_XMM1_Qa = cutting_plane_normal.z * cutting_plane_normal.z +
                 cutting_plane_normal.x * cutting_plane_normal.x +
                 cutting_plane_normal.y * cutting_plane_normal.y;
    in_XMM2_Qa = cutting_plane_normal.z;
    in_XMM3_Qa = cutting_plane_distance;
    if (in_XMM1_Qa < 0.0) {
      in_XMM1_Qa = sqrt(in_XMM1_Qa);
    }
    else {
      in_XMM1_Qa = SQRT(in_XMM1_Qa);
    }
    local_870 = (double)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730) / in_XMM1_Qa;
    local_708 = (double)CONCAT44(uStack_8ac,in_stack_fffffffffffff750) / in_XMM1_Qa;
    in_XMM1_Qa = (double)CONCAT44(uStack_8b4,in_stack_fffffffffffff748) / in_XMM1_Qa;
    local_710 = in_XMM1_Qa;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)temp_string._M_dataplus._M_p != paVar1) {
    operator_delete(temp_string._M_dataplus._M_p,
                    CONCAT71(temp_string.field_2._M_allocated_capacity._1_7_,
                             temp_string.field_2._M_local_buf[0]) + 1);
  }
  local_818.x = 0.0;
  local_818.y = 0.0;
  local_818.z = 0.0;
  layer_count = 0;
  local_768 = camera_position_vector.x;
  local_770 = camera_position_vector.y;
  local_778 = camera_position_vector.z;
  local_780 = look_at.x;
  local_788 = look_at.y;
  local_790 = look_at.z;
  local_7b0 = camera_angle;
  local_7b8 = nozzle_width;
  local_798 = filament_color.x;
  local_7a0 = filament_color.y;
  local_7a8 = filament_color.z;
  local_7c0 = transparency;
  local_7c8 = layer_only;
  local_7d0 = layer_before_and;
  uVar18 = 2;
  uVar19 = 0x1077;
  psVar16 = (string *)local_518;
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_518,in_file_name._M_dataplus._M_p,
             in_file_name._M_dataplus._M_p + in_file_name._M_string_length);
  uVar15 = (byte)massive_center_01 & 1;
  in_file_name_02 = (string *)(ulong)uVar15;
  look_at_00.z = 0.0;
  look_at_00.x = 0.0;
  look_at_00.y = 0.0;
  auVar2[8] = (char)&layer_count;
  auVar2._0_8_ = &local_818;
  auVar2._9_7_ = (int7)((ulong)&layer_count >> 8);
  auVar2._16_8_ = 0;
  cutting_plane_normal_02.x._1_7_ = uVar19;
  cutting_plane_normal_02.x._0_1_ = uVar18;
  cutting_plane_normal_02.y = (double)in_stack_fffffffffffff728;
  cutting_plane_normal_02.z._0_4_ = in_stack_fffffffffffff730;
  cutting_plane_normal_02.z._4_4_ = in_stack_fffffffffffff734;
  cutting_plane.normal.x._4_4_ = layer_count;
  cutting_plane.normal.x._0_4_ = uStack_8c8;
  cutting_plane.normal.y._0_1_ = bVar20;
  cutting_plane.normal.y._1_7_ = uVar14;
  cutting_plane.normal.z._0_4_ = in_stack_fffffffffffff748;
  cutting_plane.normal.z._4_4_ = uStack_8b4;
  cutting_plane.start_distance._0_4_ = in_stack_fffffffffffff750;
  cutting_plane.start_distance._4_4_ = uStack_8ac;
  cutting_plane.uniform_normal.x._0_1_ = local_8a8;
  cutting_plane.uniform_normal.x._1_7_ = uStack_8a7;
  cutting_plane.uniform_normal.y._0_1_ = local_8a0;
  cutting_plane.uniform_normal.y._1_7_ = uStack_89f;
  cutting_plane.uniform_normal.z._0_1_ = local_898;
  cutting_plane.uniform_normal.z._1_7_ = uStack_897;
  GetMassiveCenter((vector3)ZEXT1224(CONCAT48(uVar15,(string *)local_518)),look_at_00,
                   (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),in_XMM1_Qa,SUB81(psVar16,0),
                   (vector3)(auVar2 << 0x40),cutting_plane_normal_02,cutting_plane,in_XMM2_Qa,
                   in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,in_file_name_02,false,false,SUB81(in_R8,0),
                   (bool)uVar17,(bool)layer_only_specified,SUB41(uVar15,0),massive_center_01,
                   layer_count_00);
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Layer count: ",0xd);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,layer_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Gcode Massive center: ",0x16);
  operator<<((ostream *)&std::cout,&local_818);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Move the hole print to the original point.\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Writing POV-Ray file...\n",0x18);
  if (((ulong)layer_count_00 & 1) == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::string::find((char *)&in_file_name,0x109905,0);
    std::__cxx11::string::substr((ulong)&temp_string,(ulong)&in_file_name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_6d8,temp_string._M_dataplus._M_p,temp_string._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp_string._M_dataplus._M_p != paVar1) {
      operator_delete(temp_string._M_dataplus._M_p,
                      CONCAT71(temp_string.field_2._M_allocated_capacity._1_7_,
                               temp_string.field_2._M_local_buf[0]) + 1);
    }
    local_4c8.x = local_768;
    local_4c8.y = local_770;
    local_4c8.z = local_778;
    local_4e0.x = local_780;
    local_4e0.y = local_788;
    local_4e0.z = local_790;
    local_4f8.x = local_798;
    local_4f8.y = local_7a0;
    local_4f8.z = local_7a8;
    local_450 = CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730);
    local_448 = CONCAT44(uStack_8ac,in_stack_fffffffffffff750);
    local_440 = CONCAT44(uStack_8b4,in_stack_fffffffffffff748);
    local_438 = local_868;
    local_430 = local_870;
    local_428 = local_708;
    local_420 = local_710;
    uVar17 = 0xa1;
    local_538[0] = local_528;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_538,in_file_name._M_dataplus._M_p,
               in_file_name._M_dataplus._M_p + in_file_name._M_string_length);
    local_258 = local_818.x;
    local_250 = local_818.y;
    dStack_248 = local_818.z;
    cutting_plane_normal_01.y = (double)in_file_name_02;
    cutting_plane_normal_01.x = (double)local_538;
    cutting_plane_normal_01.z._0_4_ = (byte)local_7d8 & 1;
    cutting_plane_normal_01.z._4_4_ = 0;
    in_file_name_01._M_string_length._0_1_ = local_8a0;
    in_file_name_01._M_dataplus._M_p = (pointer)(ulong)local_8a8;
    in_file_name_01._M_string_length._1_7_ = 0;
    in_file_name_01.field_2._M_local_buf[0] = local_898;
    in_file_name_01.field_2._M_allocated_capacity._1_7_ = 0;
    in_file_name_01.field_2._8_4_ = layer_only_specified & 1;
    in_file_name_01.field_2._12_4_ = 0;
    massive_center_00.y._0_4_ = in_stack_fffffffffffff730;
    massive_center_00.x = (double)in_stack_fffffffffffff728;
    massive_center_00.y._4_4_ = in_stack_fffffffffffff734;
    massive_center_00.z._0_4_ = uStack_8c8;
    massive_center_00.z._4_4_ = layer_count;
    Generate_single_file
              (&local_4c8,&local_4e0,local_7b0,local_7b8,(bool)(bVar20 & 1),&local_4f8,
               cutting_plane_normal_01,(CuttingPlane *)(ulong)(layer_only_specified & 1),in_XMM2_Qa,
               local_7c0,local_7c8,local_7d0,in_file_name_01,SUB81(&local_450,0),SUB81(&local_258,0)
               ,SUB81((stringstream *)&ss,0),false,false,(bool)uVar17,massive_center_00,
               (stringstream *)CONCAT71(uVar14,bVar20),in_stack_fffffffffffff748,
               SUB41(in_stack_fffffffffffff750,0));
    if (local_538[0] != local_528) {
      operator_delete(local_538[0],local_528[0] + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::string::find((char *)&in_file_name,0x109905,0);
    std::__cxx11::string::substr((ulong)&temp_string,(ulong)&in_file_name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_6d8,temp_string._M_dataplus._M_p,temp_string._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp_string._M_dataplus._M_p != paVar1) {
      operator_delete(temp_string._M_dataplus._M_p,
                      CONCAT71(temp_string.field_2._M_allocated_capacity._1_7_,
                               temp_string.field_2._M_local_buf[0]) + 1);
    }
    uVar23 = (ulong)(uint)layer_count;
    if (0 < layer_count) {
      local_768 = camera_position_vector.y;
      local_770 = camera_position_vector.z;
      local_778 = look_at.x;
      local_780 = look_at.y;
      local_788 = look_at.z;
      local_7a8 = camera_angle;
      local_7b0 = nozzle_width;
      local_790 = filament_color.x;
      local_798 = filament_color.y;
      local_7a0 = filament_color.z;
      local_7b8 = transparency;
      local_7c0 = layer_only;
      local_7c8 = layer_before_and;
      local_7d0 = local_818.x;
      local_540 = local_818.y;
      iVar4 = 0;
      uVar13 = (ulong)(layer_only_specified & 1);
      uVar15 = (uint)(byte)local_7d8;
      uVar17 = SUB81(local_818.z,0);
      uVar14 = (undefined7)((ulong)local_818.z >> 8);
      dVar22 = camera_position_vector.x;
      do {
        std::__cxx11::stringstream::stringstream((stringstream *)&temp_string);
        std::__cxx11::string::find((char *)&in_file_name,0x109905,0);
        std::__cxx11::string::substr((ulong)&local_7f8,(ulong)&in_file_name);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)temp_string.field_2._M_local_buf,(char *)local_7f8,local_7f0
                            );
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\\",1);
        if (local_7f8 != local_7e8) {
          operator_delete(local_7f8,local_7e8[0] + 1);
        }
        local_468.y = local_768;
        local_468.z = local_770;
        local_480.x = local_778;
        local_480.y = local_780;
        local_480.z = local_788;
        local_498.x = local_790;
        local_498.y = local_798;
        local_498.z = local_7a0;
        local_418 = CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730);
        local_410 = CONCAT44(uStack_8ac,in_stack_fffffffffffff750);
        local_408 = CONCAT44(uStack_8b4,in_stack_fffffffffffff748);
        local_400 = local_868;
        local_3f8 = local_870;
        local_3f0 = local_708;
        local_3e8 = local_710;
        local_560[0] = local_550;
        uVar18 = 0xe0;
        local_468.x = dVar22;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_560,in_file_name._M_dataplus._M_p,
                   in_file_name._M_dataplus._M_p + in_file_name._M_string_length);
        local_4b0 = local_7d0;
        local_4a8 = local_540;
        local_4a0 = CONCAT71(uVar14,uVar17);
        cutting_plane_normal_00.y = (double)in_file_name_02;
        cutting_plane_normal_00.x = (double)local_560;
        cutting_plane_normal_00.z._0_4_ = uVar15 & 1;
        cutting_plane_normal_00.z._4_4_ = 0;
        in_file_name_00._M_string_length._0_1_ = local_8a0;
        in_file_name_00._M_dataplus._M_p = (pointer)(ulong)local_8a8;
        in_file_name_00._M_string_length._1_7_ = 0;
        in_file_name_00.field_2._M_local_buf[0] = local_898;
        in_file_name_00.field_2._M_allocated_capacity._1_7_ = 0;
        in_file_name_00.field_2._8_8_ = uVar13;
        massive_center.y._0_4_ = in_stack_fffffffffffff730;
        massive_center.x = (double)in_stack_fffffffffffff728;
        massive_center.y._4_4_ = in_stack_fffffffffffff734;
        massive_center.z._0_4_ = uStack_8c8;
        massive_center.z._4_4_ = layer_count;
        Generate_single_file
                  (&local_468,&local_480,local_7a8,local_7b0,(bool)(bVar20 & 1),&local_498,
                   cutting_plane_normal_00,in_R8,in_XMM2_Qa,local_7b8,local_7c0,local_7c8,
                   in_file_name_00,SUB81(&local_418,0),SUB81(&local_4b0,0),SUB81(&temp_string,0),
                   SUB41(iVar4,0),true,(bool)uVar18,massive_center,
                   (stringstream *)CONCAT71(uVar14,uVar17),in_stack_fffffffffffff748,
                   SUB41(in_stack_fffffffffffff750,0));
        if (local_560[0] != local_550) {
          operator_delete(local_560[0],local_550[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&temp_string);
        std::ios_base::~ios_base(local_360);
        iVar4 = iVar4 + 1;
      } while ((int)uVar23 != iVar4);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_668);
  std::fstream::~fstream(&configure_file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_file_name._M_dataplus._M_p != &in_file_name.field_2) {
    operator_delete(in_file_name._M_dataplus._M_p,
                    CONCAT71(in_file_name.field_2._M_allocated_capacity._1_7_,
                             in_file_name.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  vector3 camera_position_vector(-100, -250, 220);
  vector3 look_at(-100, 100, 30);
  double camera_angle = 60;
  double nozzle_width = 0.4;
  bool has_cutting_plane = false;
  vector3 filament_color = vector3(0.3, 0.8, 1.0) * 0.59;
  vector3 cutting_plane_normal = vector3(0.3, 0.8, 1.0) * 0.59;
  CuttingPlane cutting_plane;
  double cutting_plane_distance = 0.0;
  double transparency = 0.0;
  double layer_only = -1;
  double layer_before_and = -1;
  string in_file_name;
  bool in_file_name_specified = false;
  bool look_at_specified = false;
  bool angle_specified = false;
  bool camera_position_specified = false;
  bool layer_only_specified = false;
  bool layer_before_and_specified = false;
  bool make_layer_video = false;

  // Read configurations file.
  cout << "Reading configurations file...\n";
  fstream configure_file;
  configure_file.open("configurations.txt");
  if (!configure_file)
  {
    cout << "Configurations file not found.\n" << "Exit.\n";
    exit(0);
  }
  else
  {
    string temp_string;
    cout << "Parameters derived:\n";

    while (!configure_file.eof())
    {
      getline(configure_file, temp_string);

      if (temp_string[0] == '#' && temp_string[1] == '#')
        continue;

      int camera_location_conf_pos = temp_string.find("camera_location=v(");
      int camera_lookat_conf_pos = temp_string.find("camera_lookat=v(");
      int filament_color_conf_pos = temp_string.find("filament_color=rgb(");
      int view_angle_conf_pos = temp_string.find("view_angle=");
      int nozzle_conf_pos = temp_string.find("nozzle=");
      int file_conf_pos = temp_string.find("file=");
      int transparency_conf_pos = temp_string.find("transparency=");
      int layer_only_pos = temp_string.find("layer_only=");
      int layer_before_and_pos = temp_string.find("layer_before_and=");
      int cutting_plane_normal_pos = temp_string.find("cutting_plane_normal=");
      int cutting_plane_distance_pos = temp_string.find("cutting_plane_distance=");
      int make_layer_video_pos = temp_string.find("make_layer_video");

      //////////////////////////////////////////////////////////////////////////
      // Boolean arguments.
      if (make_layer_video_pos >= 0)
      {
        make_layer_video = true;
        cout << "make_layer_video=yes\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // Vector arguments.
      if (camera_location_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, camera_location_conf_pos + string("camera_location=v(").length(), camera_position_vector);
        camera_position_specified = true;
        cout << "camera_location=" << camera_position_vector << "\n";
      }

      if (camera_lookat_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, camera_lookat_conf_pos + string("camera_lookat=v(").length(), look_at);
        look_at_specified = true;
        cout << "camera_lookat=" << look_at << "\n";
      }

      if (filament_color_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, filament_color_conf_pos + string("filament_color=rgb(").length(), filament_color);
        cout << "filament_color=" << filament_color << "\n";
      }

      if (cutting_plane_normal_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, cutting_plane_normal_pos + string("cutting_plane_normal=v(").length(), cutting_plane_normal);
        has_cutting_plane = true;
        cout << "cutting_plane_normal=" << cutting_plane_normal << "\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // Value arguments.
      if (view_angle_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, view_angle_conf_pos + string("view_angle=").length(), camera_angle);
        angle_specified = true;
        cout << "view_angle=" << camera_angle << "\n";
      }

      if (nozzle_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, nozzle_conf_pos + string("nozzle_diameter=").length(), nozzle_width);
        cout << "nozzle_diameter=" << nozzle_width << "\n";
      }

      if (transparency_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, transparency_conf_pos + string("transparency=").length(), transparency);
        cout << "transparency=" << transparency << "\n";
      }

      if (layer_only_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, layer_only_pos + string("layer_only=").length(), layer_only);
        if (layer_only >= 0)
        {
          layer_only_specified = true;
          cout << "layer_only=" << layer_only << "\n";
        }
      }

      if (layer_before_and_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, layer_before_and_pos + string("layer_before_and=").length(), layer_before_and);
        if (layer_before_and >= 0)
        {
          layer_before_and_specified = true;
          cout << "layer_before_and=" << layer_before_and << "\n";
        }
      }

      if (cutting_plane_distance_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, cutting_plane_distance_pos + string("cutting_plane_distance=").length(), cutting_plane_distance);
        cout << "cutting_plane_distance=" << cutting_plane_distance << "\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // String arguments.
      if (file_conf_pos >= 0)
      {
        in_file_name = temp_string.substr(file_conf_pos + string("file=").length(), temp_string.size() - file_conf_pos - string("file=").length());
        in_file_name_specified = true;
        istringstream ss(in_file_name);
        ss >> in_file_name;
        cout << "file=" << in_file_name << "\n";
      }
    }

    if (has_cutting_plane)
    {
      cutting_plane = CuttingPlane(cutting_plane_normal, cutting_plane_distance);
    }
  }

  // Compute the massive center.
  vector3 massive_center(0, 0, 0);
  int layer_count = 0;
  GetMassiveCenter(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
    filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
    transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
    look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
    massive_center, layer_count);

  cout << "Layer count: " <<layer_count << "\n";
  cout << "Gcode Massive center: " << massive_center << "\n";
  cout << "Move the hole print to the original point.\n";

  // Write to the POV-Ray file.
  cout << "Writing POV-Ray file...\n";
  if (make_layer_video)
  {
    stringstream temp;
    temp << in_file_name.substr(0, in_file_name.find(".gcode"));
    // _mkdir(temp.str().c_str());

    for (int layer_index = 0; layer_index < layer_count; layer_index++)
    {
      stringstream out_file_name;
      out_file_name << in_file_name.substr(0, in_file_name.find(".gcode")) << "\\";

      Generate_single_file(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
        filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
        transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
        look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
        massive_center, out_file_name, layer_index, make_layer_video);
    }
  }
  else
  {
    stringstream out_file_name;
    out_file_name << in_file_name.substr(0, in_file_name.find(".gcode"));
#ifdef _WIN32
    SYSTEMTIME sys;
    GetLocalTime(&sys);
    out_file_name << '_' << sys.wMonth << '_' << sys.wDay << '_' << sys.wHour << '_' << sys.wMinute;
#endif

    Generate_single_file(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
      filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
      transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
      look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
      massive_center, out_file_name, 0, make_layer_video);
  }

  return 0;
}